

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int unicodeIsAlnum(unicode_tokenizer *p,int iCode)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  
  uVar2 = sqlite3FtsUnicodeIsalnum(iCode);
  if (p->nException < 1) {
    uVar3 = 0;
  }
  else {
    iVar4 = p->nException + -1;
    uVar3 = 0;
    iVar6 = 0;
    do {
      if (iVar4 < iVar6) goto LAB_001b3fff;
      uVar5 = (uint)(iVar4 + iVar6) >> 1;
      iVar1 = p->aiException[uVar5];
      if (iVar1 != iCode) {
        if (iVar1 < iCode) {
          iVar6 = uVar5 + 1;
        }
        else {
          iVar4 = uVar5 - 1;
        }
      }
    } while (iVar1 != iCode);
    uVar3 = 1;
  }
LAB_001b3fff:
  return uVar3 ^ uVar2;
}

Assistant:

static int unicodeIsAlnum(unicode_tokenizer *p, int iCode){
  assert( (sqlite3FtsUnicodeIsalnum(iCode) & 0xFFFFFFFE)==0 );
  return sqlite3FtsUnicodeIsalnum(iCode) ^ unicodeIsException(p, iCode);
}